

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O3

verifier<jwt::default_clock> * __thiscall
jwt::verifier<jwt::default_clock>::with_issuer(verifier<jwt::default_clock> *this,string *iss)

{
  pointer pcVar1;
  _storage _Var2;
  verifier<jwt::default_clock> *pvVar3;
  _Base_ptr *pp_Var4;
  ulong uVar5;
  claim local_70;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  _Base_ptr p_Stack_48;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"iss","");
  pcVar1 = (iss->_M_dataplus)._M_p;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + iss->_M_string_length);
  local_70.val.type_ = 3;
  local_70.val.u_.number_ = 0.0;
  local_70.val.u_.string_ = (string *)operator_new(0x20);
  pp_Var4 = &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                *)&(local_70.val.u_.array_)->
                   super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->
             super__Rb_tree_header)._M_header._M_parent;
  *(_Base_ptr **)
   &(local_70.val.u_.array_)->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>
       = pp_Var4;
  if (local_60 == &local_50) {
    *pp_Var4 = (_Base_ptr)CONCAT71(uStack_4f,local_50);
    *(_Base_ptr *)((long)&(local_70.val.u_.string_)->field_2 + 8) = p_Stack_48;
  }
  else {
    *(undefined1 **)
     &(local_70.val.u_.array_)->
      super__Vector_base<picojson::value,_std::allocator<picojson::value>_> = local_60;
    (((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
       *)&(local_70.val.u_.array_)->
          super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->
    super__Rb_tree_header)._M_header._M_parent = (_Base_ptr)CONCAT71(uStack_4f,local_50);
  }
  *(undefined8 *)&((_Rb_tree_header *)&(local_70.val.u_.string_)->_M_string_length)->_M_header =
       local_58;
  local_58 = 0;
  local_50 = 0;
  local_60 = &local_50;
  pvVar3 = with_claim(this,&local_40,&local_70);
  _Var2 = local_70.val.u_;
  if (local_70.val.type_ == 5) {
    if (local_70.val.u_ !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                   *)local_70.val.u_.string_);
    }
    uVar5 = 0x30;
  }
  else if (local_70.val.type_ == 4) {
    if (local_70.val.u_ !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                 local_70.val.u_.string_);
    }
    uVar5 = 0x18;
  }
  else {
    if (local_70.val.type_ != 3) goto LAB_001054bf;
    if (local_70.val.u_ !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      pp_Var4 = &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    *)&(local_70.val.u_.array_)->
                       super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->
                 super__Rb_tree_header)._M_header._M_parent;
      if ((_Base_ptr *)
          *(undefined1 **)
           &(local_70.val.u_.array_)->
            super__Vector_base<picojson::value,_std::allocator<picojson::value>_> != pp_Var4) {
        operator_delete(*(undefined1 **)
                         &(local_70.val.u_.array_)->
                          super__Vector_base<picojson::value,_std::allocator<picojson::value>_>,
                        (ulong)((long)&(*pp_Var4)->_M_color + 1));
      }
    }
    uVar5 = 0x20;
  }
  operator_delete(_Var2.string_,uVar5);
LAB_001054bf:
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return pvVar3;
}

Assistant:

verifier& with_issuer(const std::string& iss) { return with_claim("iss", claim(iss)); }